

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall sentencepiece::NormalizerSpec::SharedDtor(NormalizerSpec *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)(this->name_).tagged_ptr_.ptr_;
  if (puVar1 != &google::protobuf::internal::fixed_address_empty_string) {
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
    operator_delete(puVar1,0x20);
  }
  puVar1 = (undefined8 *)(this->precompiled_charsmap_).tagged_ptr_.ptr_;
  if (puVar1 != &google::protobuf::internal::fixed_address_empty_string) {
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
    operator_delete(puVar1,0x20);
  }
  puVar1 = (undefined8 *)(this->normalization_rule_tsv_).tagged_ptr_.ptr_;
  if (puVar1 != &google::protobuf::internal::fixed_address_empty_string) {
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
    operator_delete(puVar1,0x20);
    return;
  }
  return;
}

Assistant:

void NormalizerSpec::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  precompiled_charsmap_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  normalization_rule_tsv_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}